

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyReportNumWarnings(TidyDocImpl *doc)

{
  uint uVar1;
  uint uVar2;
  ctmbstr ptVar3;
  ctmbstr ptVar4;
  ctmbstr ptVar5;
  TidyDocImpl *doc_local;
  
  if ((doc->warnings == 0) && (doc->errors == 0)) {
    ptVar3 = tidyLocalizedString(0x80d);
    tidy_out(doc,"%s\n\n",ptVar3);
  }
  else {
    ptVar3 = tidyLocalizedString(0x807);
    uVar1 = doc->warnings;
    ptVar4 = tidyLocalizedStringN(0x809,doc->warnings);
    uVar2 = doc->errors;
    ptVar5 = tidyLocalizedStringN(0x808,doc->errors);
    tidy_out(doc,ptVar3,(ulong)uVar1,ptVar4,(ulong)uVar2,ptVar5);
    if (((doc->config).value[0x46].v < (ulong)doc->errors) ||
       ((int)(doc->config).value[0x12].v == 0)) {
      ptVar3 = tidyLocalizedString(0x80f);
      tidy_out(doc," %s\n\n",ptVar3);
    }
    else {
      tidy_out(doc,anon_var_dwarf_332d8 + 0x15c);
    }
  }
  return;
}

Assistant:

void TY_(ReportNumWarnings)( TidyDocImpl* doc )
{
    if ( doc->warnings > 0 || doc->errors > 0 )
    {
        tidy_out( doc, tidyLocalizedString(STRING_ERROR_COUNT),
                  doc->warnings, tidyLocalizedStringN( STRING_ERROR_COUNT_WARNING, doc->warnings ),
                  doc->errors, tidyLocalizedStringN( STRING_ERROR_COUNT_ERROR, doc->errors ) );

        if ( doc->errors > cfg(doc, TidyShowErrors) ||
             !cfgBool(doc, TidyShowWarnings) )
            tidy_out( doc, " %s\n\n", tidyLocalizedString(STRING_NOT_ALL_SHOWN) );
        else
            tidy_out( doc, "\n\n" );
    }
    else
        tidy_out( doc, "%s\n\n", tidyLocalizedString(STRING_NO_ERRORS) );
}